

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_thread.hpp
# Opt level: O2

self_type * __thiscall
oqpi::itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>::operator=
          (thread<oqpi::posix_thread,_oqpi::empty_layer> *this,self_type *rhs)

{
  if (this != rhs) {
    if ((this->super_type).handle_ != 0) {
      std::terminate();
    }
    posix_thread::operator=(&this->super_type,&rhs->super_type);
  }
  return this;
}

Assistant:

self_type& operator =(self_type &&rhs)
        {
            if (this != &rhs)
            {
                if (joinable())
                {
                    std::terminate();
                }
                thread_impl::operator =(std::move(rhs));
            }
            return (*this);
        }